

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_cgreen_pipe.c
# Opt level: O2

ssize_t cgreen_pipe_write(int p,void *buf,size_t count)

{
  int line;
  ssize_t sVar1;
  int *piVar2;
  char *fmt;
  int status;
  
  sVar1 = write(p,buf,count);
  if ((int)sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x20) {
      if (*piVar2 == 0xb) {
        fmt = "Too many assertions within a single test.";
        line = 0x3f;
      }
      else {
        fmt = "Error when reporting from test case process to reporter.";
        line = 0x41;
      }
      panic("src/posix_cgreen_pipe.c",line,fmt);
    }
    raise(0xd);
    wait(&status);
  }
  return (long)(int)sVar1;
}

Assistant:

ssize_t cgreen_pipe_write(int p, const void *buf, size_t count)
{
    int pipe_write_result = write(p, buf, count);
    int status;
    if (pipe_write_result < 0) {
        if (errno == EWOULDBLOCK) {
            PANIC("Too many assertions within a single test.");
        } else if (errno != EPIPE) {
            PANIC("Error when reporting from test case process to reporter.");
        }
        raise(SIGPIPE);
        wait(&status); /* Safe-guarding against a signalhandler for SIGPIPE, which
                          incidentally the test case for pipe block need to have... */
    }
    return pipe_write_result;
}